

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v8::detail::dragonbox::cache_accessor<double>::compute_mul_parity
               (carrier_uint two_f,cache_entry_type *cache,int beta_minus_1)

{
  uint64_t uVar1;
  int beta_minus_1_local;
  cache_entry_type *cache_local;
  carrier_uint two_f_local;
  
  if (beta_minus_1 < 1) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
                ,0x750,"");
  }
  if (beta_minus_1 < 0x40) {
    uVar1 = umul192_middle64((dragonbox *)two_f,(uint64_t)cache->internal_,
                             (uint128_wrapper)cache->internal_);
    return (uVar1 >> (0x40U - (char)beta_minus_1 & 0x3f) & 1) != 0;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
              ,0x751,"");
}

Assistant:

static bool compute_mul_parity(carrier_uint two_f,
                                 const cache_entry_type& cache,
                                 int beta_minus_1) FMT_NOEXCEPT {
    FMT_ASSERT(beta_minus_1 >= 1, "");
    FMT_ASSERT(beta_minus_1 < 64, "");

    return ((umul192_middle64(two_f, cache) >> (64 - beta_minus_1)) & 1) != 0;
  }